

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILPSolver.cpp
# Opt level: O2

void __thiscall CILPSolver::Print(CILPSolver *this,char *pFileName,int iOptioin)

{
  if (iOptioin == 3) {
    glp_lpx_print_mip((LPX_conflict *)this->m_pLPX,pFileName);
    return;
  }
  if (iOptioin == 2) {
    glp_lpx_print_prob((LPX_conflict *)this->m_pLPX,pFileName);
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/ILPSolver.cpp"
                ,0x1d2,"void CILPSolver::Print(char *, int)");
}

Assistant:

void CILPSolver::Print(char* pFileName, int iOptioin)
{
	switch(iOptioin) {
	case SOL_PRINT_PRO:	
		lpx_print_prob(m_pLPX,pFileName);
		break;
	case SOL_PRINT_SOL:	
		lpx_print_mip(m_pLPX,pFileName);
		break;
	default:
		assert(0);
		break;
	}
}